

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  Expression *value;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *pTVar3;
  Diagnostic *pDVar4;
  Compilation *pCVar5;
  int *piVar6;
  ExpressionSyntax *pEVar7;
  ElementSelectSyntax *syntax_00;
  ConstantRange *this;
  pointer this_00;
  ValueSymbol *this_01;
  bool bVar8;
  const_iterator cVar9;
  iterator_range<slang::ast::Scope::iterator> iVar10;
  optional<slang::ConstantRange> oVar11;
  SourceRange local_510;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_500;
  StreamExpression local_4f0;
  SourceLocation local_4d8;
  SourceLocation SStack_4d0;
  undefined4 local_4c4;
  Symbol *local_4c0;
  iterator local_4b8;
  Symbol *local_4b0;
  undefined1 local_4a8 [8];
  iterator_range<slang::ast::Scope::iterator> members;
  UnpackedUnionType *uu;
  Type *type;
  _Optional_payload_base<unsigned_int> local_480;
  _Storage<slang::ConstantRange,_true> local_478;
  int32_t local_470;
  _Storage<slang::ConstantRange,_true> local_468;
  optional<slang::ConstantRange> range;
  EvalContext evalCtx;
  ASTContext local_230;
  SourceLocation local_1f8;
  SourceLocation SStack_1f0;
  undefined4 local_1dc;
  Type *local_1d8;
  Type *arrayType;
  optional<unsigned_int> constantWithWidth;
  Expression *withExpr;
  bitmask<slang::ast::ASTFlags> local_1b8;
  bitmask<slang::ast::ASTFlags> local_1b0;
  Expression *local_1a8;
  Expression *arg;
  StreamExpressionSyntax *argSyntax;
  const_iterator __end2;
  undefined1 local_178 [8];
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *__range2;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  _Optional_payload_base<int> local_b8;
  optional<int> count;
  Diagnostic *diag;
  Expression *local_78;
  Expression *sliceExpr;
  DiagCode local_64;
  bitmask<slang::ast::ASTFlags> local_60;
  undefined1 local_58 [8];
  anon_class_24_3_37492b14 badResult;
  size_t sliceSize;
  bool isRightToLeft;
  bool isDestination;
  Type *assignmentTarget_local;
  ASTContext *context_local;
  StreamingConcatenationExpressionSyntax *syntax_local;
  Compilation *comp_local;
  
  bVar8 = (syntax->operatorToken).kind == LeftShift;
  badResult.syntax = (StreamingConcatenationExpressionSyntax *)0x0;
  badResult.comp = (Compilation *)&badResult.syntax;
  local_58 = (undefined1  [8])comp;
  badResult.sliceSize = (size_t *)syntax;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_60,StreamingAllowed);
  bVar1 = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (syntax->sliceSize == (ExpressionSyntax *)0x0) {
      if (bVar8) {
        badResult.syntax = (StreamingConcatenationExpressionSyntax *)0x1;
      }
    }
    else {
      pEVar7 = syntax->sliceSize;
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&diag,AllowDataType);
      iVar2 = Expression::bind((int)pEVar7,(sockaddr *)context,(socklen_t)diag);
      local_78 = (Expression *)CONCAT44(extraout_var,iVar2);
      bVar1 = Expression::bad(local_78);
      if (bVar1) {
        pCVar5 = (Compilation *)
                 fromSyntax::anon_class_24_3_37492b14::operator()
                           ((anon_class_24_3_37492b14 *)local_58);
        return (Expression *)pCVar5;
      }
      if (local_78->kind == DataType) {
        pTVar3 = not_null<const_slang::ast::Type_*>::operator->(&local_78->type);
        bVar1 = Type::isFixedSize(pTVar3);
        if (!bVar1) {
          pDVar4 = ASTContext::addDiag(context,(DiagCode)0x2c0007,local_78->sourceRange);
          pTVar3 = not_null<const_slang::ast::Type_*>::operator->(&local_78->type);
          bVar1 = SourceLocation::operator_cast_to_bool(&(pTVar3->super_Symbol).location);
          if (bVar1) {
            pTVar3 = not_null<const_slang::ast::Type_*>::operator->(&local_78->type);
            count.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
                 = *(_Optional_base<int,_true,_true> *)&(pTVar3->super_Symbol).location;
            Diagnostic::addNote(pDVar4,(DiagCode)0x40001,
                                (SourceLocation)
                                count.super__Optional_base<int,_true,_true>._M_payload.
                                super__Optional_payload_base<int>);
          }
          pCVar5 = (Compilation *)
                   fromSyntax::anon_class_24_3_37492b14::operator()
                             ((anon_class_24_3_37492b14 *)local_58);
          return (Expression *)pCVar5;
        }
        pTVar3 = not_null<const_slang::ast::Type_*>::operator->(&local_78->type);
        badResult.syntax = (StreamingConcatenationExpressionSyntax *)Type::bitstreamWidth(pTVar3);
      }
      else {
        local_b8 = (_Optional_payload_base<int>)ASTContext::evalInteger(context,local_78);
        bVar1 = ASTContext::requireGtZero(context,(optional<int>)local_b8,local_78->sourceRange);
        if (!bVar1) {
          pCVar5 = (Compilation *)
                   fromSyntax::anon_class_24_3_37492b14::operator()
                             ((anon_class_24_3_37492b14 *)local_58);
          return (Expression *)pCVar5;
        }
        piVar6 = std::optional<int>::operator*((optional<int> *)&local_b8);
        badResult.syntax = (StreamingConcatenationExpressionSyntax *)(long)*piVar6;
      }
      if (!bVar8) {
        badResult.syntax = (StreamingConcatenationExpressionSyntax *)0x0;
        join_0x00000010_0x00000000_ =
             slang::syntax::SyntaxNode::sourceRange(&syntax->sliceSize->super_SyntaxNode);
        ASTContext::addDiag(context,(DiagCode)0x980007,join_0x00000010_0x00000000_);
      }
    }
    SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL>::SmallVector
              ((SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> *)
               &__range2);
    __begin2.index = (size_t)&syntax->expressions;
    cVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)__begin2.index)
    ;
    __begin2.list = (ParentList *)cVar9.index;
    local_178 = (undefined1  [8])cVar9.list;
    cVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)__begin2.index)
    ;
    while( true ) {
      __end2.list = (ParentList *)cVar9.index;
      argSyntax = (StreamExpressionSyntax *)cVar9.list;
      bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_const_slang::syntax::StreamExpressionSyntax_**,_const_slang::syntax::StreamExpressionSyntax_*&>
              ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_const_slang::syntax::StreamExpressionSyntax_**,_const_slang::syntax::StreamExpressionSyntax_*&>
                            *)local_178,
                           (iterator_base<const_slang::syntax::StreamExpressionSyntax_*> *)
                           &argSyntax);
      if (!bVar1) break;
      arg = (Expression *)
            slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::
            iterator_base<const_slang::syntax::StreamExpressionSyntax_*>::operator*
                      ((iterator_base<const_slang::syntax::StreamExpressionSyntax_*> *)local_178);
      if ((assignmentTarget == (Type *)0x0) ||
         (pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                             ((not_null<slang::syntax::ExpressionSyntax_*> *)&arg->constant),
         (pEVar7->super_SyntaxNode).kind != StreamingConcatenationExpression)) {
        pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)&arg->constant);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_1b8,StreamingAllowed);
        local_1a8 = Expression::selfDetermined(comp,pEVar7,context,local_1b8);
      }
      else {
        pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)&arg->constant);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_1b0,StreamingAllowed);
        local_1a8 = Expression::create(comp,pEVar7,context,local_1b0,assignmentTarget);
      }
      bVar1 = Expression::bad(local_1a8);
      if (bVar1) {
        comp_local = (Compilation *)
                     fromSyntax::anon_class_24_3_37492b14::operator()
                               ((anon_class_24_3_37492b14 *)local_58);
        goto LAB_006929a4;
      }
      constantWithWidth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&arrayType);
      if (arg->syntax != (ExpressionSyntax *)0x0) {
        local_1d8 = not_null<const_slang::ast::Type_*>::operator*(&local_1a8->type);
        bVar1 = Type::isUnpackedArray(local_1d8);
        if ((bVar1) && (bVar1 = Type::isAssociativeArray(local_1d8), !bVar1)) {
          pTVar3 = Type::getArrayElementType(local_1d8);
          bVar1 = Type::isFixedSize(pTVar3);
          value = local_1a8;
          if (bVar1) {
            syntax_00 = not_null<slang::syntax::ElementSelectSyntax_*>::operator*
                                  ((not_null<slang::syntax::ElementSelectSyntax_*> *)
                                   (arg->syntax + 2));
            bitmask<slang::ast::ASTFlags>::bitmask
                      ((bitmask<slang::ast::ASTFlags> *)&evalCtx.disableRange.endLoc,
                       StreamingWithRange);
            ASTContext::resetFlags
                      (&local_230,context,(bitmask<slang::ast::ASTFlags>)evalCtx.disableRange.endLoc
                      );
            constantWithWidth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int> =
                 (_Optional_base<unsigned_int,_true,_true>)
                 Expression::bindSelector(comp,value,syntax_00,&local_230);
            bVar1 = Expression::bad((Expression *)
                                    constantWithWidth.super__Optional_base<unsigned_int,_true,_true>
                                    ._M_payload.super__Optional_payload_base<unsigned_int>);
            if (!bVar1) {
              range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right._3_1_ = 0
              ;
              bitmask<slang::ast::EvalFlags>::bitmask
                        ((bitmask<slang::ast::EvalFlags> *)
                         ((long)&range.super__Optional_base<slang::ConstantRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                 _M_payload + 7));
              EvalContext::EvalContext
                        ((EvalContext *)
                         &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_engaged,comp,
                         (bitmask<slang::ast::EvalFlags>)
                         range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.
                         right._3_1_);
              oVar11 = Expression::evalSelector
                                 ((Expression *)
                                  constantWithWidth.super__Optional_base<unsigned_int,_true,_true>.
                                  _M_payload.super__Optional_payload_base<unsigned_int>,
                                  (EvalContext *)
                                  &range.super__Optional_base<slang::ConstantRange,_true,_true>.
                                   _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                   _M_engaged);
              local_478 = oVar11.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_payload;
              local_470 = CONCAT31(local_470._1_3_,
                                   oVar11.super__Optional_base<slang::ConstantRange,_true,_true>.
                                   _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                   _M_engaged);
              range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.left =
                   local_470;
              local_468 = local_478;
              bVar1 = std::optional::operator_cast_to_bool((optional *)&local_468._M_value);
              if (bVar1) {
                this = std::optional<slang::ConstantRange>::operator->
                                 ((optional<slang::ConstantRange> *)&local_468._M_value);
                type._4_4_ = ConstantRange::width(this);
                std::optional<unsigned_int>::optional<unsigned_int,_true>
                          ((optional<unsigned_int> *)&local_480,(uint *)((long)&type + 4));
                arrayType = (Type *)local_480;
              }
              EvalContext::~EvalContext
                        ((EvalContext *)
                         &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_engaged);
              goto LAB_006925c5;
            }
            comp_local = (Compilation *)
                         fromSyntax::anon_class_24_3_37492b14::operator()
                                   ((anon_class_24_3_37492b14 *)local_58);
            goto LAB_006929a4;
          }
        }
        local_1dc = 0x300007;
        local_1f8 = (local_1a8->sourceRange).startLoc;
        SStack_1f0 = (local_1a8->sourceRange).endLoc;
        ASTContext::addDiag(context,(DiagCode)0x300007,local_1a8->sourceRange);
        comp_local = (Compilation *)
                     fromSyntax::anon_class_24_3_37492b14::operator()
                               ((anon_class_24_3_37492b14 *)local_58);
        goto LAB_006929a4;
      }
LAB_006925c5:
      pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)&arg->constant);
      if ((pEVar7->super_SyntaxNode).kind != StreamingConcatenationExpression) {
        uu = (UnpackedUnionType *)not_null::operator_cast_to_Type_((not_null *)&local_1a8->type);
        bVar1 = Type::isUnpackedUnion((Type *)uu);
        if ((bVar1) && (bVar1 = Type::isTaggedUnion((Type *)uu), !bVar1)) {
          pTVar3 = Type::getCanonicalType((Type *)uu);
          members.m_end.current =
               (Symbol *)Symbol::as<slang::ast::UnpackedUnionType>(&pTVar3->super_Symbol);
          iVar10 = Scope::members(&((UnpackedUnionType *)members.m_end.current)->super_Scope);
          members.m_begin = iVar10.m_end.current;
          local_4a8 = (undefined1  [8])iVar10.m_begin.current;
          local_4b0 = (Symbol *)
                      iterator_range<slang::ast::Scope::iterator>::begin
                                ((iterator_range<slang::ast::Scope::iterator> *)local_4a8);
          local_4b8 = iterator_range<slang::ast::Scope::iterator>::end
                                ((iterator_range<slang::ast::Scope::iterator> *)local_4a8);
          bVar1 = iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                  ::operator!=((iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                                *)&local_4b0,&local_4b8);
          if (bVar1) {
            local_4c0 = (Symbol *)
                        iterator_range<slang::ast::Scope::iterator>::begin
                                  ((iterator_range<slang::ast::Scope::iterator> *)local_4a8);
            this_00 = iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                      ::operator->((iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                                    *)&local_4c0);
            this_01 = Symbol::as<slang::ast::ValueSymbol>(this_00);
            uu = (UnpackedUnionType *)ValueSymbol::getType(this_01);
          }
        }
        bVar1 = Type::isBitstreamType
                          (&uu->super_Type,(bool)((assignmentTarget != (Type *)0x0 ^ 0xffU) & 1));
        if (!bVar1) {
          local_4c4 = 0x2a0007;
          local_4d8 = (local_1a8->sourceRange).startLoc;
          SStack_4d0 = (local_1a8->sourceRange).endLoc;
          pDVar4 = ASTContext::addDiag(context,(DiagCode)0x2a0007,local_1a8->sourceRange);
          pTVar3 = not_null<const_slang::ast::Type_*>::operator*(&local_1a8->type);
          ast::operator<<(pDVar4,pTVar3);
          comp_local = (Compilation *)
                       fromSyntax::anon_class_24_3_37492b14::operator()
                                 ((anon_class_24_3_37492b14 *)local_58);
          goto LAB_006929a4;
        }
      }
      not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression*&,void>
                ((not_null<slang::ast::Expression_const*> *)&local_4f0,&local_1a8);
      local_4f0.withExpr =
           (Expression *)
           constantWithWidth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      local_4f0.constantWithWidth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)arrayType;
      SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::push_back
                ((SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *)
                 &__range2,&local_4f0);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_const_slang::syntax::StreamExpressionSyntax_**,_const_slang::syntax::StreamExpressionSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_const_slang::syntax::StreamExpressionSyntax_**,_const_slang::syntax::StreamExpressionSyntax_*&>
                    *)local_178);
      cVar9.index = (size_t)__end2.list;
      cVar9.list = (ParentList *)argSyntax;
    }
    pTVar3 = Compilation::getVoidType(comp);
    local_500 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
                ccopy((SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                       *)&__range2,&comp->super_BumpAllocator);
    local_510 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    comp_local = (Compilation *)
                 BumpAllocator::
                 emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                           (&comp->super_BumpAllocator,pTVar3,(unsigned_long *)&badResult.syntax,
                            &local_500,&local_510);
LAB_006929a4:
    SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL>::~SmallVector
              ((SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> *)
               &__range2);
  }
  else {
    local_64.subsystem = Expressions;
    local_64.code = 0x29;
    sliceExpr = (Expression *)parsing::Token::location(&syntax->operatorToken);
    ASTContext::addDiag(context,local_64,(SourceLocation)sliceExpr);
    comp_local = (Compilation *)
                 fromSyntax::anon_class_24_3_37492b14::operator()
                           ((anon_class_24_3_37492b14 *)local_58);
  }
  return (Expression *)comp_local;
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context, const Type* assignmentTarget) {

    // The sole purpose of assignmentTarget here is to know whether this is a
    // "destination" stream (i.e. an unpack operation) or whether it is a source / pack.
    // Streaming concatenation is self-determined and its size/type should not be affected
    // by assignmentTarget.
    const bool isDestination = !assignmentTarget;

    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    size_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, span<const StreamExpression>(),
                                 syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->bitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<size_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        Expression* arg;
        if (assignmentTarget &&
            argSyntax->expression->kind == SyntaxKind::StreamingConcatenationExpression) {
            arg = &create(comp, *argSyntax->expression, context, ASTFlags::StreamingAllowed,
                          assignmentTarget);
        }
        else {
            arg = &selfDetermined(comp, *argSyntax->expression, context,
                                  ASTFlags::StreamingAllowed);
        }

        if (arg->bad())
            return badResult();

        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue). Interpreted as fixed-sized unpacked arrays,
            // dynamic arrays, or queues of fixed-size elements.
            auto& arrayType = *arg->type;
            if (!arrayType.isUnpackedArray() || arrayType.isAssociativeArray() ||
                !arrayType.getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg->sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, *arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            EvalContext evalCtx(comp);
            auto range = withExpr->evalSelector(evalCtx);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            const Type* type = arg->type;
            if (type->isUnpackedUnion() && !type->isTaggedUnion()) {
                auto& uu = type->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    type = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!type->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg->sourceRange) << *arg->type;
                return badResult();
            }
        }

        buffer.push_back({arg, withExpr, constantWithWidth});
    }

    // Streaming concatenation has no explicit type. Use void to prevent problems when
    // its type is passed to context-determined expressions.
    return *comp.emplace<StreamingConcatenationExpression>(comp.getVoidType(), sliceSize,
                                                           buffer.ccopy(comp),
                                                           syntax.sourceRange());
}